

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

size_t __thiscall Reducer::reduceDestructively(Reducer *this,int factor_)

{
  size_t sVar1;
  bool bVar2;
  ostream *poVar3;
  Module *module;
  PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_> *this_00;
  undefined1 local_48 [8];
  ProgramResult result;
  int factor__local;
  Reducer *this_local;
  
  this->factor = factor_;
  result.time._4_4_ = factor_;
  loadWorking(this);
  this->reduced = 0;
  this->funcsSeen = 0;
  ProgramResult::ProgramResult((ProgramResult *)local_48);
  bVar2 = writeAndTestReduction(this,(ProgramResult *)local_48);
  if (!bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "\n|! WARNING: writing before destructive reduction fails, very unlikely reduction can work\n"
                            );
    poVar3 = std::operator<<(poVar3,(ProgramResult *)local_48);
    std::operator<<(poVar3,'\n');
  }
  this_00 = &(this->
             super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
             ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
  module = wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::getModule
                     (&this_00->
                       super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>);
  wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::walkModule
            (&this_00->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,module)
  ;
  sVar1 = this->reduced;
  ProgramResult::~ProgramResult((ProgramResult *)local_48);
  return sVar1;
}

Assistant:

size_t reduceDestructively(int factor_) {
    factor = factor_;
    // prepare
    loadWorking();
    reduced = 0;
    funcsSeen = 0;
    // Before we do any changes, it should be valid to write out the module:
    // size should be as expected, and output should be as expected.
    ProgramResult result;
    if (!writeAndTestReduction(result)) {
      std::cerr << "\n|! WARNING: writing before destructive reduction fails, "
                   "very unlikely reduction can work\n"
                << result << '\n';
    }
    // destroy!
    walkModule(getModule());
    return reduced;
  }